

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Warfare_Header.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Warfare_Header::Encode(Warfare_Header *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Warfare_Header *this_local;
  
  Header7::Encode(&this->super_Header,stream);
  pKVar1 = DATA_TYPE::operator<<(stream,(DataTypeBase *)&this->m_FiringEntityID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_TargetEntityID);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_MunitionID);
  DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_EventID);
  return;
}

Assistant:

void Warfare_Header::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );
    stream << KDIS_STREAM m_FiringEntityID
           << KDIS_STREAM m_TargetEntityID
           << KDIS_STREAM m_MunitionID
           << KDIS_STREAM m_EventID;
}